

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void av1_decode_xq(int *xqd,int *xq,sgr_params_type *params)

{
  sgr_params_type *params_local;
  int *xq_local;
  int *xqd_local;
  
  if (params->r[0] == 0) {
    *xq = 0;
    xq[1] = 0x80 - xqd[1];
  }
  else if (params->r[1] == 0) {
    *xq = *xqd;
    xq[1] = 0;
  }
  else {
    *xq = *xqd;
    xq[1] = (0x80 - *xq) - xqd[1];
  }
  return;
}

Assistant:

void av1_decode_xq(const int *xqd, int *xq, const sgr_params_type *params) {
  if (params->r[0] == 0) {
    xq[0] = 0;
    xq[1] = (1 << SGRPROJ_PRJ_BITS) - xqd[1];
  } else if (params->r[1] == 0) {
    xq[0] = xqd[0];
    xq[1] = 0;
  } else {
    xq[0] = xqd[0];
    xq[1] = (1 << SGRPROJ_PRJ_BITS) - xq[0] - xqd[1];
  }
}